

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlmvn.cc
# Opt level: O0

void __thiscall
klogic::mlmvn::export_neurons
          (mlmvn *this,cvector *all_weights,vector<int,_std::allocator<int>_> *k_values)

{
  vector<int,_std::allocator<int>_> *this_00;
  ulong uVar1;
  size_t sVar2;
  size_type sVar3;
  const_reference pvVar4;
  int local_7c;
  complex<double> *local_78;
  complex<double> *local_70;
  __normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_68;
  __normal_iterator<std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
  local_60;
  const_iterator local_58;
  cvector *local_50;
  cvector *weights;
  const_reference pvStack_40;
  int k;
  vector<klogic::mvn,_std::allocator<klogic::mvn>_> *layer_neurons;
  size_type sStack_30;
  int layer;
  size_t n_neurons;
  size_t n_weights;
  vector<int,_std::allocator<int>_> *k_values_local;
  cvector *all_weights_local;
  mlmvn *this_local;
  
  n_weights = (size_t)k_values;
  k_values_local = (vector<int,_std::allocator<int>_> *)all_weights;
  all_weights_local = (cvector *)this;
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::clear(all_weights);
  std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)n_weights);
  get_stats(this,&n_neurons,&stack0xffffffffffffffd0);
  std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::reserve
            ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)k_values_local,
             n_neurons);
  std::vector<int,_std::allocator<int>_>::reserve
            ((vector<int,_std::allocator<int>_> *)n_weights,sStack_30);
  layer_neurons._4_4_ = 0;
  while( true ) {
    uVar1 = (ulong)layer_neurons._4_4_;
    sVar2 = layers_count(this);
    if (sVar2 <= uVar1) break;
    pvStack_40 = std::
                 vector<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>,_std::allocator<std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>_>_>
                 ::operator[](&this->neurons,(long)layer_neurons._4_4_);
    weights._4_4_ = 0;
    while( true ) {
      uVar1 = (ulong)weights._4_4_;
      sVar3 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::size(pvStack_40);
      if (sVar3 <= uVar1) break;
      pvVar4 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::operator[]
                         (pvStack_40,(long)weights._4_4_);
      local_50 = mvn::weights_vector(pvVar4);
      this_00 = k_values_local;
      local_60._M_current =
           (complex<double> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                     ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                      k_values_local);
      __gnu_cxx::
      __normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
      ::__normal_iterator<std::complex<double>*>
                ((__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>
                  *)&local_58,&local_60);
      local_68._M_current =
           (complex<double> *)
           std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::begin
                     (local_50);
      local_70 = (complex<double> *)
                 std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::end
                           (local_50);
      local_78 = (complex<double> *)
                 std::vector<std::complex<double>,std::allocator<std::complex<double>>>::
                 insert<__gnu_cxx::__normal_iterator<std::complex<double>const*,std::vector<std::complex<double>,std::allocator<std::complex<double>>>>,void>
                           ((vector<std::complex<double>,std::allocator<std::complex<double>>> *)
                            this_00,local_58,local_68,
                            (__normal_iterator<const_std::complex<double>_*,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>
                             )local_70);
      sVar2 = n_weights;
      pvVar4 = std::vector<klogic::mvn,_std::allocator<klogic::mvn>_>::operator[]
                         (pvStack_40,(long)weights._4_4_);
      local_7c = mvn::k_value(pvVar4);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)sVar2,&local_7c);
      weights._4_4_ = weights._4_4_ + 1;
    }
    layer_neurons._4_4_ = layer_neurons._4_4_ + 1;
  }
  sVar3 = std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>::size
                    ((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)
                     k_values_local);
  if (sVar3 == n_neurons) {
    sVar3 = std::vector<int,_std::allocator<int>_>::size
                      ((vector<int,_std::allocator<int>_> *)n_weights);
    if (sVar3 == sStack_30) {
      return;
    }
    __assert_fail("k_values.size() == n_neurons",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc"
                  ,0xb9,
                  "void klogic::mlmvn::export_neurons(klogic::cvector &, std::vector<int> &) const")
    ;
  }
  __assert_fail("all_weights.size() == n_weights",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/be9[P]mlmvn/lib/mlmvn.cc",
                0xb8,
                "void klogic::mlmvn::export_neurons(klogic::cvector &, std::vector<int> &) const");
}

Assistant:

void klogic::mlmvn::export_neurons(klogic::cvector &all_weights, std::vector<int> &k_values) const
{
    all_weights.clear();
    k_values.clear();

    // calculate number of weights and reserve this size
    size_t n_weights, n_neurons;

    get_stats(n_weights, n_neurons);

    all_weights.reserve(n_weights);
    k_values.reserve(n_neurons);

    for (int layer = 0; layer < layers_count(); ++layer) {
        const vector<mvn> &layer_neurons = neurons[layer];

        for (int k = 0; k < layer_neurons.size(); ++k) {
            // Neuron [(k+1), (layer+1)]
            const cvector &weights(layer_neurons[k].weights_vector());

            all_weights.insert(all_weights.end(), weights.begin(), weights.end());
            k_values.push_back(layer_neurons[k].k_value());
        }
    }

    // Sanity check
    assert(all_weights.size() == n_weights);
    assert(k_values.size() == n_neurons);
}